

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

SchnorrPubkey * __thiscall
cfd::core::TapBranch::GetTweakedPubkey
          (SchnorrPubkey *__return_storage_ptr__,TapBranch *this,SchnorrPubkey *internal_pubkey,
          bool *parity)

{
  ByteData256 hash;
  ByteData256 local_38;
  
  GetTapTweak(&local_38,this,internal_pubkey);
  SchnorrPubkey::CreateTweakAdd(__return_storage_ptr__,internal_pubkey,&local_38,parity);
  if (local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

SchnorrPubkey TapBranch::GetTweakedPubkey(
    const SchnorrPubkey& internal_pubkey, bool* parity) const {
  ByteData256 hash = GetTapTweak(internal_pubkey);
  return internal_pubkey.CreateTweakAdd(hash, parity);
}